

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_fill_triangle(nk_command_buffer *b,float x0,float y0,float x1,float y1,float x2,float y2,
                     nk_color c)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float in_XMM4_Db;
  float in_XMM5_Db;
  
  if (b != (nk_command_buffer *)0x0) {
    if ((0xffffff < (uint)c) &&
       (((b->use_clipping == 0 ||
         ((((fVar1 = (b->clip).x, fVar1 <= x0 && (x0 < (b->clip).w + fVar1)) &&
           (fVar2 = (b->clip).y, fVar2 <= y0)) && (y0 < fVar2 + (b->clip).h)))) ||
        (((((fVar1 <= x1 && (x1 < (b->clip).w + fVar1)) && (fVar2 = (b->clip).y, fVar2 <= y1)) &&
          (y1 < fVar2 + (b->clip).h)) ||
         (((fVar1 <= x2 && (x2 < fVar1 + (b->clip).w)) &&
          ((fVar1 = (b->clip).y, fVar1 <= y2 && (y2 < fVar1 + (b->clip).h)))))))))) {
      pvVar3 = nk_command_buffer_push(b,NK_COMMAND_TRIANGLE_FILLED,0x20);
      if (pvVar3 != (void *)0x0) {
        auVar4._0_4_ = (int)x0;
        auVar4._4_4_ = (int)y0;
        auVar4._8_4_ = (int)x1;
        auVar4._12_4_ = (int)y1;
        auVar4 = packssdw(auVar4,auVar4);
        *(long *)((long)pvVar3 + 0x10) = auVar4._0_8_;
        auVar5._0_4_ = (int)x2;
        auVar5._4_4_ = (int)y2;
        auVar5._8_4_ = (int)in_XMM4_Db;
        auVar5._12_4_ = (int)in_XMM5_Db;
        auVar4 = pshuflw(auVar5,auVar5,0xe8);
        *(int *)((long)pvVar3 + 0x18) = auVar4._0_4_;
        *(short *)((long)pvVar3 + 0x1c) = c._0_2_;
        *(nk_byte *)((long)pvVar3 + 0x1e) = c.b;
        *(nk_byte *)((long)pvVar3 + 0x1f) = c.a;
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x234d,
                "void nk_fill_triangle(struct nk_command_buffer *, float, float, float, float, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_fill_triangle(struct nk_command_buffer *b, float x0, float y0, float x1,
    float y1, float x2, float y2, struct nk_color c)
{
    struct nk_command_triangle_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0) return;
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INBOX(x0, y0, clip->x, clip->y, clip->w, clip->h) &&
            !NK_INBOX(x1, y1, clip->x, clip->y, clip->w, clip->h) &&
            !NK_INBOX(x2, y2, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_triangle_filled*)
        nk_command_buffer_push(b, NK_COMMAND_TRIANGLE_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->a.x = (short)x0;
    cmd->a.y = (short)y0;
    cmd->b.x = (short)x1;
    cmd->b.y = (short)y1;
    cmd->c.x = (short)x2;
    cmd->c.y = (short)y2;
    cmd->color = c;
}